

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

world_ptr __thiscall
APhyBullet::BulletEngine::createDynamicsWorld
          (BulletEngine *this,collision_dispatcher_ref *collision_dispatcher,
          broadphase_ref *broadphase,constraint_solver_ref *constraint_solver,
          collision_configuration_ref *collision_configuration)

{
  world *pwVar1;
  world_ptr in_RAX;
  btDiscreteDynamicsWorld *this_00;
  ref<aphy::world> rVar2;
  ref<aphy::world> result;
  ref<aphy::world> local_38;
  
  rVar2.counter = (world_ptr)0x0;
  if (((collision_dispatcher->counter != (Counter *)0x0) &&
      (constraint_solver->counter != (Counter *)0x0)) &&
     (collision_configuration->counter != (Counter *)0x0)) {
    local_38.counter = in_RAX;
    this_00 = (btDiscreteDynamicsWorld *)btDiscreteDynamicsWorld::operator_new(0x1c8);
    btDiscreteDynamicsWorld::btDiscreteDynamicsWorld
              (this_00,(btDispatcher *)
                       collision_dispatcher->counter->object[1].super_base_interface.
                       _vptr_base_interface,
               (btBroadphaseInterface *)
               broadphase->counter->object[1].super_base_interface._vptr_base_interface,
               (btConstraintSolver *)
               constraint_solver->counter->object[1].super_base_interface._vptr_base_interface,
               (btCollisionConfiguration *)
               collision_configuration->counter->object[1].super_base_interface._vptr_base_interface
              );
    aphy::makeObjectWithInterface<aphy::world,APhyBullet::BulletWorld,btDiscreteDynamicsWorld*>
              ((aphy *)&local_38,this_00);
    pwVar1 = (local_38.counter)->object;
    aphy::ref<aphy::collision_dispatcher>::operator=
              ((ref<aphy::collision_dispatcher> *)&pwVar1[1].super_base_interface.myRefCounter,
               collision_dispatcher);
    aphy::ref<aphy::broadphase>::operator=((ref<aphy::broadphase> *)(pwVar1 + 2),broadphase);
    aphy::ref<aphy::constraint_solver>::operator=
              ((ref<aphy::constraint_solver> *)&pwVar1[2].super_base_interface.myRefCounter,
               constraint_solver);
    aphy::ref<aphy::collision_configuration>::operator=
              ((ref<aphy::collision_configuration> *)(pwVar1 + 3),collision_configuration);
    rVar2.counter = local_38.counter;
    local_38.counter = (Counter *)0x0;
    aphy::ref<aphy::world>::~ref(&local_38);
  }
  return rVar2.counter;
}

Assistant:

world_ptr BulletEngine::createDynamicsWorld(const collision_dispatcher_ref &collision_dispatcher, const broadphase_ref &broadphase, const constraint_solver_ref &constraint_solver, const collision_configuration_ref &collision_configuration)
{
    if(!collision_dispatcher)
        return nullptr;
    if(!constraint_solver)
        return nullptr;
    if(!collision_configuration)
        return nullptr;

    auto result = makeObject<BulletWorld> (
        new btDiscreteDynamicsWorld(collision_dispatcher.as<BulletCollisionDispatcher>()->handle,
            broadphase.as<BulletBroadphase>()->handle,
            constraint_solver.as<BulletConstraintSolver>()->handle,
            collision_configuration.as<BulletCollisionConfiguration>()->handle));

    auto world = result.as<BulletWorld> ();
    world->collisionDispatcher = collision_dispatcher;
    world->broadphase = broadphase;
    world->constraintSolver = constraint_solver;
    world->collisionConfiguration = collision_configuration;
    return result.disown();
}